

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

uint32_t leveldb::Hash(char *data,size_t n,uint32_t seed)

{
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  
  pcVar1 = data + n;
  uVar2 = (int)n * -0x395b586d ^ seed;
  for (pcVar3 = data + 4; pcVar3 <= pcVar1; pcVar3 = pcVar3 + 4) {
    uVar2 = (uVar2 + *(int *)(pcVar3 + -4)) * -0x395b586d;
    uVar2 = uVar2 >> 0x10 ^ uVar2;
    n = n - 4;
  }
  if (n != 1) {
    if (n != 2) {
      if (n != 3) {
        return uVar2;
      }
      uVar2 = uVar2 + (uint)(byte)pcVar3[-2] * 0x10000;
    }
    uVar2 = uVar2 + (uint)(byte)pcVar3[-3] * 0x100;
  }
  uVar2 = ((byte)pcVar3[-4] + uVar2) * -0x395b586d;
  return uVar2 >> 0x18 ^ uVar2;
}

Assistant:

uint32_t Hash(const char* data, size_t n, uint32_t seed) {
  // Similar to murmur hash
  const uint32_t m = 0xc6a4a793;
  const uint32_t r = 24;
  const char* limit = data + n;
  uint32_t h = seed ^ (n * m);

  // Pick up four bytes at a time
  while (data + 4 <= limit) {
    uint32_t w = DecodeFixed32(data);
    data += 4;
    h += w;
    h *= m;
    h ^= (h >> 16);
  }

  // Pick up remaining bytes
  switch (limit - data) {
    case 3:
      h += static_cast<uint8_t>(data[2]) << 16;
      FALLTHROUGH_INTENDED;
    case 2:
      h += static_cast<uint8_t>(data[1]) << 8;
      FALLTHROUGH_INTENDED;
    case 1:
      h += static_cast<uint8_t>(data[0]);
      h *= m;
      h ^= (h >> r);
      break;
  }
  return h;
}